

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aGen.hpp
# Opt level: O3

ByteCode * __thiscall ag::Generator::Get(ByteCode *__return_storage_ptr__,Generator *this)

{
  pointer *ppuVar1;
  uint16_t uVar2;
  iterator iVar3;
  pointer pcVar4;
  pointer pvVar5;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  unsigned_long uVar8;
  pointer puVar9;
  pointer puVar10;
  size_t __n;
  uchar uVar11;
  int iVar12;
  ulong uVar13;
  uint16_t *puVar14;
  undefined1 *puVar15;
  ulong uVar16;
  short *psVar17;
  undefined4 *puVar18;
  pointer pvVar19;
  pointer pbVar20;
  pointer pFVar21;
  int *piVar22;
  pointer pbVar23;
  size_t i;
  long lVar24;
  long lVar25;
  pointer pbVar26;
  pointer pvVar27;
  pointer pvVar28;
  short sVar29;
  uint uVar30;
  size_t sVar31;
  pointer pvVar32;
  size_t sVar33;
  void *pvVar34;
  size_t sVar35;
  long lVar36;
  size_t sVar37;
  size_type *psVar38;
  bool bVar39;
  vector<ag::FunctionData,_std::allocator<ag::FunctionData>_> funcs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> methodStartAddr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ret_4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> funcStartAddr;
  vector<ag::FunctionData,_std::allocator<ag::FunctionData>_> local_230;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_218;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1f8;
  allocator_type local_1d9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1d8;
  long local_1b8;
  void *local_1b0;
  long *local_1a8;
  ulong local_1a0;
  long local_198 [2];
  long local_188;
  ByteCode local_180;
  ByteCode local_168;
  long *local_150;
  ulong local_148;
  long local_140 [2];
  long *local_130;
  ulong local_128;
  long local_120 [2];
  long *local_110;
  ulong local_108;
  long local_100 [2];
  long *local_f0;
  ulong local_e8;
  long local_e0 [2];
  long *local_d0;
  ulong local_c8;
  long local_c0 [2];
  long *local_b0;
  size_type local_a8;
  long local_a0 [2];
  ulong local_90;
  ulong local_88;
  variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  agvariant local_58;
  
  (__return_storage_ptr__->m_bytes).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->m_bytes).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_bytes).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"BVM","");
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_230,local_a8,
             (allocator_type *)&local_1d8);
  if (local_a8 != 0) {
    uVar13 = 0;
    do {
      *(undefined1 *)
       (CONCAT71(local_230.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                 _M_impl.super__Vector_impl_data._M_start._1_7_,
                 (uchar)local_230.
                        super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                        _M_impl.super__Vector_impl_data._M_start) + uVar13) =
           *(undefined1 *)((long)local_b0 + uVar13);
      uVar13 = uVar13 + 1;
    } while (uVar13 < local_a8);
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             (__return_storage_ptr__->m_bytes).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,
             CONCAT71(local_230.
                      super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                      _M_impl.super__Vector_impl_data._M_start._1_7_,
                      (uchar)local_230.
                             super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                             ._M_impl.super__Vector_impl_data._M_start),
             local_230.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  pvVar34 = (void *)CONCAT71(local_230.
                             super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                             (uchar)local_230.
                                    super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
  if (pvVar34 != (void *)0x0) {
    operator_delete(pvVar34,(long)local_230.
                                  super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar34
                   );
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  local_230.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = this->m_ver_major;
  iVar3._M_current =
       (__return_storage_ptr__->m_bytes).
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (__return_storage_ptr__->m_bytes).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,iVar3,
               (uchar *)&local_230);
  }
  else {
    *iVar3._M_current =
         (uchar)local_230.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                _M_impl.super__Vector_impl_data._M_start;
    ppuVar1 = &(__return_storage_ptr__->m_bytes).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  uVar2 = this->m_ver_minor;
  puVar14 = (uint16_t *)operator_new(2);
  *puVar14 = uVar2;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             (__return_storage_ptr__->m_bytes).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,puVar14,puVar14 + 1);
  operator_delete(puVar14,2);
  pbVar20 = (this->m_strtbl).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar23 = (this->m_strtbl).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  puVar15 = (undefined1 *)operator_new(4);
  uVar13 = (long)pbVar23 - (long)pbVar20;
  *puVar15 = (char)(uVar13 >> 5);
  puVar15[1] = (char)(uVar13 >> 0xd);
  puVar15[2] = (char)(uVar13 >> 0x15);
  puVar15[3] = (char)(uVar13 >> 0x1d);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             (__return_storage_ptr__->m_bytes).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,puVar15,puVar15 + 4);
  operator_delete(puVar15,4);
  pbVar20 = (this->m_strtbl).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_strtbl).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar20) {
    uVar13 = 0;
    do {
      pcVar4 = pbVar20[uVar13]._M_dataplus._M_p;
      local_d0 = local_c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar4,pcVar4 + pbVar20[uVar13]._M_string_length);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_230,local_c8 + 1,
                 (allocator_type *)&local_1d8);
      if (local_c8 != 0) {
        uVar16 = 0;
        do {
          *(undefined1 *)
           (CONCAT71(local_230.
                     super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl
                     .super__Vector_impl_data._M_start._1_7_,
                     (uchar)local_230.
                            super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                            _M_impl.super__Vector_impl_data._M_start) + uVar16) =
               *(undefined1 *)((long)local_d0 + uVar16);
          uVar16 = uVar16 + 1;
        } while (uVar16 < local_c8);
      }
      local_230.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].field_0x47 = 0;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->m_bytes).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 CONCAT71(local_230.
                          super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                          _M_impl.super__Vector_impl_data._M_start._1_7_,
                          (uchar)local_230.
                                 super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                 ._M_impl.super__Vector_impl_data._M_start),
                 local_230.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      pvVar34 = (void *)CONCAT71(local_230.
                                 super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                 ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                 (uchar)local_230.
                                        super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
      if (pvVar34 != (void *)0x0) {
        operator_delete(pvVar34,(long)local_230.
                                      super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)pvVar34);
      }
      if (local_d0 != local_c0) {
        operator_delete(local_d0,local_c0[0] + 1);
      }
      uVar13 = uVar13 + 1;
      pbVar20 = (this->m_strtbl).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(this->m_strtbl).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar20 >> 5)
            );
  }
  pbVar20 = (this->m_globals).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar23 = (this->m_globals).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  puVar15 = (undefined1 *)operator_new(2);
  uVar30 = (int)pbVar23 - (int)pbVar20;
  *puVar15 = (char)(uVar30 >> 5);
  puVar15[1] = (char)(uVar30 >> 0xd);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             (__return_storage_ptr__->m_bytes).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,puVar15,puVar15 + 2);
  operator_delete(puVar15,2);
  pbVar20 = (this->m_globals).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_globals).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar20) {
    uVar13 = 0;
    do {
      pcVar4 = pbVar20[uVar13]._M_dataplus._M_p;
      local_f0 = local_e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,pcVar4,pcVar4 + pbVar20[uVar13]._M_string_length);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_230,local_e8 + 1,
                 (allocator_type *)&local_1d8);
      if (local_e8 != 0) {
        uVar16 = 0;
        do {
          *(undefined1 *)
           (CONCAT71(local_230.
                     super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl
                     .super__Vector_impl_data._M_start._1_7_,
                     (uchar)local_230.
                            super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                            _M_impl.super__Vector_impl_data._M_start) + uVar16) =
               *(undefined1 *)((long)local_f0 + uVar16);
          uVar16 = uVar16 + 1;
        } while (uVar16 < local_e8);
      }
      local_230.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].field_0x47 = 0;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->m_bytes).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 CONCAT71(local_230.
                          super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                          _M_impl.super__Vector_impl_data._M_start._1_7_,
                          (uchar)local_230.
                                 super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                 ._M_impl.super__Vector_impl_data._M_start),
                 local_230.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      pvVar34 = (void *)CONCAT71(local_230.
                                 super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                 ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                 (uchar)local_230.
                                        super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
      if (pvVar34 != (void *)0x0) {
        operator_delete(pvVar34,(long)local_230.
                                      super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)pvVar34);
      }
      if (local_f0 != local_e0) {
        operator_delete(local_f0,local_e0[0] + 1);
      }
      uVar13 = uVar13 + 1;
      pbVar20 = (this->m_globals).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(this->m_globals).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar20 >> 5)
            );
  }
  std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>::vector
            (&local_230,&(this->Function).m_funcs);
  local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  pFVar21 = (pointer)CONCAT71(local_230.
                              super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                              ._M_impl.super__Vector_impl_data._M_start._1_7_,
                              (uchar)local_230.
                                     super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
  if (local_230.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
      super__Vector_impl_data._M_finish == pFVar21) {
    sVar29 = 0;
  }
  else {
    lVar36 = 0;
    uVar13 = 0;
    sVar29 = 0;
    do {
      iVar12 = std::__cxx11::string::compare
                         ((char *)((long)&(pFVar21->Object)._M_dataplus._M_p + lVar36));
      sVar29 = sVar29 + (ushort)(iVar12 == 0);
      uVar13 = uVar13 + 1;
      pFVar21 = (pointer)CONCAT71(local_230.
                                  super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                  (uchar)local_230.
                                         super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
      lVar36 = lVar36 + 0x48;
    } while (uVar13 < (ulong)(((long)local_230.
                                     super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar21 >> 3
                              ) * -0x71c71c71c71c71c7));
  }
  psVar17 = (short *)operator_new(2);
  *psVar17 = sVar29;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             (__return_storage_ptr__->m_bytes).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,psVar17);
  operator_delete(psVar17,2);
  pFVar21 = (pointer)CONCAT71(local_230.
                              super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                              ._M_impl.super__Vector_impl_data._M_start._1_7_,
                              (uchar)local_230.
                                     super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
  if (local_230.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
      super__Vector_impl_data._M_finish != pFVar21) {
    uVar13 = 0;
    do {
      iVar12 = std::__cxx11::string::compare((char *)(pFVar21 + uVar13));
      if (iVar12 == 0) {
        lVar36 = *(long *)(CONCAT71(local_230.
                                    super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                    (uchar)local_230.
                                           super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                           ._M_impl.super__Vector_impl_data._M_start) + 0x20 +
                          uVar13 * 0x48);
        local_110 = local_100;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,lVar36,
                   *(long *)(CONCAT71(local_230.
                                      super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                      (uchar)local_230.
                                             super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                             ._M_impl.super__Vector_impl_data._M_start) + 0x28 +
                            uVar13 * 0x48) + lVar36);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_218,local_108 + 1,(allocator_type *)&local_1f8);
        if (local_108 != 0) {
          uVar16 = 0;
          do {
            local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar16] = *(uchar *)((long)local_110 + uVar16);
            uVar16 = uVar16 + 1;
          } while (uVar16 < local_108);
        }
        local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish[-1] = '\0';
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   (__return_storage_ptr__->m_bytes).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        if (local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_218.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_218.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_218.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_110 != local_100) {
          operator_delete(local_110,local_100[0] + 1);
        }
        local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (__return_storage_ptr__->m_bytes).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish +
             -(long)(__return_storage_ptr__->m_bytes).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
        if (local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&local_1d8,
                     (iterator)
                     local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_218);
        }
        else {
          *local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish =
               (unsigned_long)
               local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        puVar18 = (undefined4 *)operator_new(4);
        *puVar18 = 0;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   (__return_storage_ptr__->m_bytes).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish,puVar18,puVar18 + 1);
        operator_delete(puVar18,4);
      }
      uVar13 = uVar13 + 1;
      pFVar21 = (pointer)CONCAT71(local_230.
                                  super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                  (uchar)local_230.
                                         super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
    } while (uVar13 < (ulong)(((long)local_230.
                                     super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar21 >> 3
                              ) * -0x71c71c71c71c71c7));
  }
  uVar11 = (char)((uint)(*(int *)&(this->m_consts).
                                  super__Vector_base<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                        *(int *)&(this->m_consts).
                                 super__Vector_base<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33;
  local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,uVar11);
  iVar3._M_current =
       (__return_storage_ptr__->m_bytes).
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (__return_storage_ptr__->m_bytes).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,iVar3,
               (uchar *)&local_218);
  }
  else {
    *iVar3._M_current = uVar11;
    ppuVar1 = &(__return_storage_ptr__->m_bytes).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  pvVar32 = (this->m_consts).
            super__Vector_base<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar19 = (this->m_consts).
            super__Vector_base<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar13 = 0;
  pvVar27 = pvVar19;
  do {
    bVar39 = pvVar27 != pvVar32;
    pvVar27 = pvVar32;
    if (bVar39) {
      lVar36 = 0;
      uVar16 = 0;
      bVar39 = false;
      do {
        if (uVar13 == *(byte *)((long)&(pvVar32->
                                       super__Variant_base<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ).
                                       super__Move_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                       .
                                       super__Copy_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                       .
                                       super__Move_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                       .
                                       super__Copy_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                       .
                                       super__Variant_storage_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                       ._M_index + lVar36)) {
          if (!bVar39) {
            std::__detail::__variant::
            _Copy_ctor_base<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_Copy_ctor_base((_Copy_ctor_base<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_80,
                              (_Copy_ctor_base<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)((long)&(pvVar32->
                                         super__Variant_base<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         ).
                                         super__Move_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                         .
                                         super__Copy_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                         .
                                         super__Move_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                         .
                                         super__Copy_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                         .
                                         super__Variant_storage_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                         ._M_u + lVar36));
            uVar11 = (uchar)(0x807010403 >>
                            ((byte)(local_80.
                                    super__Variant_base<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    .
                                    super__Move_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                    .
                                    super__Copy_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                    .
                                    super__Move_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                    .
                                    super__Copy_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                    .
                                    super__Variant_storage_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                    ._32_4_ << 3) & 0x3f));
            if (4 < local_80.
                    super__Variant_base<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Move_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                    .
                    super__Copy_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                    .
                    super__Move_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                    .
                    super__Copy_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                    .
                    super__Variant_storage_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                    ._M_index) {
              uVar11 = '\0';
            }
            local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(local_218.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,uVar11);
            iVar3._M_current =
                 (__return_storage_ptr__->m_bytes).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (__return_storage_ptr__->m_bytes).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              _M_realloc_insert<unsigned_char_const&>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                         __return_storage_ptr__,iVar3,(uchar *)&local_218);
            }
            else {
              *iVar3._M_current = uVar11;
              ppuVar1 = &(__return_storage_ptr__->m_bytes).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
            (*std::__detail::__variant::
              __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
              ::_S_vtable._M_arr
              [local_80.
               super__Variant_base<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .
               super__Move_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
               .
               super__Copy_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
               .
               super__Move_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
               .
               super__Copy_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
               .
               super__Variant_storage_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
               ._M_index]._M_data)((anon_class_1_0_00000001 *)&local_218,&local_80);
            local_80.
            super__Variant_base<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .
            super__Move_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
            .
            super__Copy_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
            .
            super__Move_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
            .
            super__Copy_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
            .
            super__Variant_storage_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
            ._M_index = 0xff;
            pvVar32 = (this->m_consts).
                      super__Vector_base<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          std::__detail::__variant::
          _Copy_ctor_base<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_Copy_ctor_base((_Copy_ctor_base<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_58,
                            (_Copy_ctor_base<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)((long)&(pvVar32->
                                       super__Variant_base<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ).
                                       super__Move_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                       .
                                       super__Copy_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                       .
                                       super__Move_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                       .
                                       super__Copy_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                       .
                                       super__Variant_storage_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                       ._M_u + lVar36));
          BitConverter::Get(&local_218,&local_58);
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     (__return_storage_ptr__->m_bytes).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
          if (local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_218.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_218.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_218.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          (*std::__detail::__variant::
            __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
            ::_S_vtable._M_arr
            [local_58.
             super__Variant_base<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Move_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
             .
             super__Copy_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
             .
             super__Move_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
             .
             super__Copy_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
             .
             super__Variant_storage_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
             ._M_index]._M_data)((anon_class_1_0_00000001 *)&local_1f8,&local_58);
          local_58.
          super__Variant_base<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .
          super__Move_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
          .
          super__Copy_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
          .super__Move_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
          .super__Copy_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
          .
          super__Variant_storage_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
          ._M_index = 0xff;
          pvVar32 = (this->m_consts).
                    super__Vector_base<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pvVar19 = (this->m_consts).
                    super__Vector_base<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          bVar39 = true;
        }
        uVar16 = uVar16 + 1;
        lVar36 = lVar36 + 0x28;
        pvVar27 = pvVar19;
      } while (uVar16 < (ulong)(((long)pvVar19 - (long)pvVar32 >> 3) * -0x3333333333333333));
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 5);
  local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar20 = (this->m_objNames).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar23 = (this->m_objNames).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  puVar15 = (undefined1 *)operator_new(2);
  uVar30 = (int)pbVar23 - (int)pbVar20;
  *puVar15 = (char)(uVar30 >> 5);
  puVar15[1] = (char)(uVar30 >> 0xd);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             (__return_storage_ptr__->m_bytes).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,puVar15,puVar15 + 2);
  operator_delete(puVar15,2);
  pbVar20 = (this->m_objNames).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar23 = (this->m_objNames).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar26 = pbVar23;
  if (pbVar23 != pbVar20) {
    pvVar34 = (void *)0x0;
    pbVar23 = pbVar20;
    do {
      pcVar4 = pbVar23[(long)pvVar34]._M_dataplus._M_p;
      local_150 = local_140;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_150,pcVar4,pcVar4 + pbVar23[(long)pvVar34]._M_string_length);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_1f8,local_148 + 1,&local_1d9);
      if (local_148 != 0) {
        uVar13 = 0;
        do {
          local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar13] = *(uchar *)((long)local_150 + uVar13);
          uVar13 = uVar13 + 1;
        } while (uVar13 < local_148);
      }
      local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish[-1] = '\0';
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->m_bytes).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      if (local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1f8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_150 != local_140) {
        operator_delete(local_150,local_140[0] + 1);
      }
      pvVar5 = (this->m_objProps).
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = pvVar5[(long)pvVar34].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      pbVar20 = *(pointer *)
                 ((long)&pvVar5[(long)pvVar34].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data + 8);
      local_1b0 = pvVar34;
      puVar15 = (undefined1 *)operator_new(2);
      uVar30 = (int)pbVar20 - (int)uVar6;
      *puVar15 = (char)(uVar30 >> 5);
      puVar15[1] = (char)(uVar30 >> 0xd);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->m_bytes).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,puVar15,puVar15 + 2);
      operator_delete(puVar15,2);
      pvVar5 = (this->m_objProps).
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar20 = pvVar5[(long)pvVar34].
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar5[(long)pvVar34].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data + 8) != pbVar20) {
        uVar13 = 0;
        do {
          pcVar4 = pbVar20[uVar13]._M_dataplus._M_p;
          local_130 = local_120;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_130,pcVar4,pcVar4 + pbVar20[uVar13]._M_string_length);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    (&local_1f8,local_128 + 1,&local_1d9);
          if (local_128 != 0) {
            uVar16 = 0;
            do {
              local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar16] = *(uchar *)((long)local_130 + uVar16);
              uVar16 = uVar16 + 1;
            } while (uVar16 < local_128);
          }
          local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish[-1] = '\0';
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     (__return_storage_ptr__->m_bytes).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
          if (local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1f8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_1f8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1f8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_130 != local_120) {
            operator_delete(local_130,local_120[0] + 1);
          }
          uVar13 = uVar13 + 1;
          pvVar5 = (this->m_objProps).
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar20 = pvVar5[(long)pvVar34].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar13 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar5[(long)pvVar34].
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                  (long)pbVar20 >> 5));
      }
      pvVar28 = (this->m_objMethods).
                super__Vector_base<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>,_std::allocator<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = pvVar28[(long)pvVar34].
              super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
              super__Vector_impl_data._M_start;
      pFVar21 = *(pointer *)
                 ((long)&pvVar28[(long)pvVar34].
                         super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                         _M_impl.super__Vector_impl_data + 8);
      psVar17 = (short *)operator_new(2);
      *psVar17 = (short)((uint)((int)pFVar21 - (int)uVar6) >> 3) * -0x71c7;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->m_bytes).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,psVar17,psVar17 + 1);
      operator_delete(psVar17,2);
      pvVar28 = (this->m_objMethods).
                super__Vector_base<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>,_std::allocator<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pFVar21 = pvVar28[(long)pvVar34].
                super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar28[(long)pvVar34].
                   super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
                   super__Vector_impl_data + 8) != pFVar21) {
        uVar13 = 0;
        do {
          local_1a8 = local_198;
          _Var7._M_p = pFVar21[uVar13].Name._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a8,_Var7._M_p,
                     _Var7._M_p + pFVar21[uVar13].Name._M_string_length);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    (&local_1f8,local_1a0 + 1,&local_1d9);
          if (local_1a0 != 0) {
            uVar16 = 0;
            do {
              local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar16] = *(uchar *)((long)local_1a8 + uVar16);
              uVar16 = uVar16 + 1;
            } while (uVar16 < local_1a0);
          }
          local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish[-1] = '\0';
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     (__return_storage_ptr__->m_bytes).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
          if (local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1f8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_1f8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1f8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_1a8 != local_198) {
            operator_delete(local_1a8,local_198[0] + 1);
          }
          local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (__return_storage_ptr__->m_bytes).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish +
               -(long)(__return_storage_ptr__->m_bytes).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
          if (local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_218,
                       (iterator)
                       local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_1f8);
          }
          else {
            *(pointer *)
             local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish =
                 local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
            local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)((long)local_218.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + 8);
          }
          puVar18 = (undefined4 *)operator_new(4);
          *puVar18 = 0;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     (__return_storage_ptr__->m_bytes).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish,puVar18,puVar18 + 1);
          operator_delete(puVar18,4);
          uVar13 = uVar13 + 1;
          pvVar28 = (this->m_objMethods).
                    super__Vector_base<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>,_std::allocator<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pFVar21 = pvVar28[(long)pvVar34].
                    super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar13 < (ulong)(((long)*(pointer *)
                                          ((long)&pvVar28[(long)pvVar34].
                                                  super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                   (long)pFVar21 >> 3) * -0x71c71c71c71c71c7));
      }
      pvVar34 = (void *)((long)local_1b0 + 1);
      pbVar23 = (this->m_objNames).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar26 = (this->m_objNames).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (pvVar34 < (void *)((long)pbVar26 - (long)pbVar23 >> 5));
  }
  pFVar21 = (pointer)CONCAT71(local_230.
                              super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                              ._M_impl.super__Vector_impl_data._M_start._1_7_,
                              (uchar)local_230.
                                     super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
  if (local_230.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
      super__Vector_impl_data._M_finish != pFVar21) {
    sVar37 = 0;
    lVar36 = 0;
    do {
      iVar12 = std::__cxx11::string::compare((char *)(pFVar21 + sVar37));
      if (iVar12 == 0) {
        uVar8 = local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar36];
        puVar9 = (__return_storage_ptr__->m_bytes).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar10 = (__return_storage_ptr__->m_bytes).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        piVar22 = (int *)operator_new(4);
        *piVar22 = (int)puVar10 - (int)puVar9;
        lVar24 = 0;
        do {
          (__return_storage_ptr__->m_bytes).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar24 + uVar8] = *(uchar *)((long)piVar22 + lVar24);
          lVar24 = lVar24 + 1;
        } while (lVar24 != 4);
        operator_delete(piVar22,4);
        FunctionManager::Get(&local_168,&this->Function,sVar37);
        uVar13 = (long)local_168.m_bytes.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_168.m_bytes.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if (uVar13 == 0) {
          pvVar34 = (void *)0x0;
          sVar35 = 0;
        }
        else {
          if ((long)uVar13 < 0) {
            std::__throw_bad_alloc();
          }
          pvVar34 = operator_new(uVar13);
          sVar35 = (long)local_168.m_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_168.m_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
        }
        if (local_168.m_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_168.m_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          memmove(pvVar34,local_168.m_bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,sVar35);
        }
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   (__return_storage_ptr__->m_bytes).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish,pvVar34,sVar35 + (long)pvVar34);
        if (pvVar34 != (void *)0x0) {
          operator_delete(pvVar34,uVar13);
        }
        if (local_168.m_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_168.m_bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_168.m_bytes.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_168.m_bytes.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        lVar36 = lVar36 + 1;
      }
      sVar37 = sVar37 + 1;
      pFVar21 = (pointer)CONCAT71(local_230.
                                  super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                  (uchar)local_230.
                                         super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
    } while (sVar37 < (ulong)(((long)local_230.
                                     super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar21 >> 3
                              ) * -0x71c71c71c71c71c7));
    pbVar23 = (this->m_objNames).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar26 = (this->m_objNames).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pbVar26 != pbVar23) {
    pvVar28 = (this->m_objMethods).
              super__Vector_base<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>,_std::allocator<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = 0;
    lVar36 = 0;
    do {
      local_188 = uVar13 * 3;
      if (*(pointer *)
           ((long)&pvVar28[uVar13].
                   super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
                   super__Vector_impl_data + 8) !=
          pvVar28[uVar13].super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        uVar16 = 0;
        local_90 = uVar13;
        do {
          lVar24 = *(long *)(local_218.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar36 * 8);
          puVar9 = (__return_storage_ptr__->m_bytes).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar10 = (__return_storage_ptr__->m_bytes).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          piVar22 = (int *)operator_new(4);
          *piVar22 = (int)puVar10 - (int)puVar9;
          lVar25 = 0;
          do {
            (__return_storage_ptr__->m_bytes).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[lVar25 + lVar24] = *(uchar *)((long)piVar22 + lVar25);
            lVar25 = lVar25 + 1;
          } while (lVar25 != 4);
          operator_delete(piVar22,4);
          pFVar21 = (this->Function).m_funcs.
                    super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar24 = (long)(this->Function).m_funcs.
                         super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)pFVar21;
          local_88 = uVar16;
          if (lVar24 == 0) {
            sVar37 = 0;
          }
          else {
            lVar25 = *(long *)((long)&(((this->m_objMethods).
                                        super__Vector_base<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>,_std::allocator<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                      )._M_impl.super__Vector_impl_data + local_188 * 8);
            lVar24 = (lVar24 >> 3) * -0x71c71c71c71c71c7;
            sVar35 = *(size_t *)(lVar25 + 0x28 + uVar16 * 0x48);
            pvVar34 = *(void **)(lVar25 + 0x20 + uVar16 * 0x48);
            local_1b0 = *(void **)(lVar25 + uVar16 * 0x48);
            __n = *(size_t *)(lVar25 + 8 + uVar16 * 0x48);
            sVar31 = lVar24 + (ulong)(lVar24 == 0);
            psVar38 = &(pFVar21->Name)._M_string_length;
            sVar33 = 0;
            local_1b8 = lVar36;
            do {
              if (((*psVar38 == sVar35) &&
                  (((sVar35 == 0 ||
                    (iVar12 = bcmp((((string *)(psVar38 + -1))->_M_dataplus)._M_p,pvVar34,sVar35),
                    iVar12 == 0)) && (psVar38[-4] == __n)))) &&
                 ((sVar37 = sVar33, lVar36 = local_1b8, __n == 0 ||
                  (iVar12 = bcmp((void *)psVar38[-5],local_1b0,__n), lVar36 = local_1b8, iVar12 == 0
                  )))) break;
              sVar33 = sVar33 + 1;
              psVar38 = psVar38 + 9;
              sVar37 = sVar31;
              lVar36 = local_1b8;
            } while (sVar31 != sVar33);
          }
          FunctionManager::Get(&local_180,&this->Function,sVar37);
          uVar13 = (long)local_180.m_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_180.m_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
          if (uVar13 == 0) {
            pvVar34 = (void *)0x0;
            sVar35 = 0;
          }
          else {
            if ((long)uVar13 < 0) {
              std::__throw_bad_alloc();
            }
            pvVar34 = operator_new(uVar13);
            sVar35 = (long)local_180.m_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_180.m_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
          }
          if (local_180.m_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              local_180.m_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            memmove(pvVar34,local_180.m_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,sVar35);
          }
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     (__return_storage_ptr__->m_bytes).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish,pvVar34,sVar35 + (long)pvVar34);
          if (pvVar34 != (void *)0x0) {
            operator_delete(pvVar34,uVar13);
          }
          if (local_180.m_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_180.m_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_180.m_bytes.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_180.m_bytes.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          lVar36 = lVar36 + 1;
          pvVar28 = (this->m_objMethods).
                    super__Vector_base<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>,_std::allocator<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar16 = local_88 + 1;
        } while (uVar16 < (ulong)((*(long *)((long)&(pvVar28->
                                                                                                        
                                                  super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                                  )._M_impl.super__Vector_impl_data +
                                            local_188 * 8 + 8) -
                                   *(long *)((long)&(pvVar28->
                                                                                                        
                                                  super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                                  )._M_impl.super__Vector_impl_data + local_188 * 8)
                                  >> 3) * -0x71c71c71c71c71c7));
        pbVar23 = (this->m_objNames).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar26 = (this->m_objNames).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        uVar13 = local_90;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)((long)pbVar26 - (long)pbVar23 >> 5));
  }
  if (local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_218.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>::~vector(&local_230);
  return __return_storage_ptr__;
}

Assistant:

inline ByteCode Get()
		{
			ByteCode bret;


			// header
			bret.Add(BitConverter::GetString(std::string("BVM"), false));


			// version
			bret.Add(m_ver_major);
			bret.Add(BitConverter::GetUInt16(m_ver_minor));


			// string table
			bret.Add(BitConverter::GetUInt32(m_strtbl.size()));
			for (size_t i = 0; i < m_strtbl.size(); i++)
				bret.Add(BitConverter::GetString(m_strtbl[i]));

			// globals
			bret.Add(BitConverter::GetUInt16(m_globals.size()));
			for (size_t i = 0; i < m_globals.size(); i++)
				bret.Add(BitConverter::GetString(m_globals[i]));	// name


															// function names
			std::vector<FunctionData> funcs = Function.GetData();
			std::vector<size_t> funcStartAddr;

			uint16_t funcCount = 0;
			for (size_t i = 0; i < funcs.size(); i++) {
				if (funcs[i].Object != "")
					continue;
				funcCount++;
			}
			bret.Add(BitConverter::GetUInt16(funcCount));

			for (size_t i = 0; i < funcs.size(); i++) {
				if (funcs[i].Object != "")
					continue;

				bret.Add(BitConverter::GetString(funcs[i].Name));
				funcStartAddr.push_back(bret.Count());
				bret.Add(BitConverter::GetUInt32(0u));
			}


			// constants
			bret.Add(m_consts.size());
			for (size_t t = 0; t < variant_type_count; t++) {
				bool written = false;
				for (size_t i = 0; i < m_consts.size(); i++) {
					if (m_consts[i].index() == t) {
						if (!written) {
							bret.Add((uint8_t)VariantToType(m_consts[i]));
							written = true;
						}
						bret.Add(BitConverter::Get(m_consts[i]));
					}
				}
			}


			// objects
			std::vector<size_t> methodStartAddr;
			bret.Add(BitConverter::GetUInt16(m_objNames.size()));
			for (size_t i = 0; i < m_objNames.size(); i++) {
				bret.Add(BitConverter::GetString(m_objNames[i]));

				bret.Add(BitConverter::GetUInt16(m_objProps[i].size()));
				for (size_t j = 0; j < m_objProps[i].size(); j++)
					bret.Add(BitConverter::GetString(m_objProps[i][j]));

				bret.Add(BitConverter::GetUInt16(m_objMethods[i].size()));
				for (size_t j = 0; j < m_objMethods[i].size(); j++) {
					bret.Add(BitConverter::GetString(m_objMethods[i][j].Name));
					methodStartAddr.push_back(bret.Count());
					bret.Add(BitConverter::GetUInt32(0u));
				}
			}


			// function code
			size_t curFunc = 0;
			for (size_t i = 0; i < funcs.size(); i++) {
				if (funcs[i].Object != "")
					continue;

				bret.Write(funcStartAddr[curFunc], BitConverter::GetUInt32(bret.Count()));
				bret.Add(Function.Get(i));
				curFunc++;
			}

			// method code
			size_t curMethod = 0;
			for (size_t i = 0; i < m_objNames.size(); i++) {
				for (size_t j = 0; j < m_objMethods[i].size(); j++) {
					bret.Write(methodStartAddr[curMethod], BitConverter::GetUInt32(bret.Count()));
					bret.Add(Function.Get(m_objMethods[i][j].Name, m_objMethods[i][j].Object));
					// TODO: method overloading
					curMethod++;
				}
			}

			return bret;
		}